

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  uint *puVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  PointerType PVar4;
  WirePointer *pWVar5;
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  Fault f;
  undefined1 local_98 [32];
  bool local_78;
  ListBuilder local_70;
  PointerBuilder local_48;
  
  puVar1 = &this->childInitializedCount;
  local_98._8_8_ = &this->childCount;
  local_78 = this->childInitializedCount < this->childCount;
  local_98._16_8_ = " < ";
  local_98._24_8_ = (WirePointer *)0x4;
  if (local_78) {
    pSVar2 = (this->node)._builder.segment;
    pCVar3 = (this->node)._builder.capTable;
    pWVar5 = (this->node)._builder.pointers + 3;
    local_98._0_8_ = pSVar2;
    local_98._8_8_ = pCVar3;
    local_98._16_8_ = pWVar5;
    PVar4 = capnp::_::PointerBuilder::getPointerType((PointerBuilder *)local_98);
    local_70.segment = pSVar2;
    local_70.capTable = pCVar3;
    local_70.ptr = (byte *)pWVar5;
    if (PVar4 == NULL_) {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema((Builder *)local_98,this);
      }
      capnp::_::PointerBuilder::initStructList
                ((ListBuilder *)local_98,(PointerBuilder *)&local_70,this->childCount,
                 (StructSize)0x40003);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,(ListBuilder *)local_98,
                 this->childInitializedCount);
      local_48.pointer = (this->sourceInfo)._builder.pointers + 1;
      local_48.segment = (this->sourceInfo)._builder.segment;
      local_48.capTable = (this->sourceInfo)._builder.capTable;
      capnp::_::PointerBuilder::initStructList
                (&local_70,&local_48,this->childCount,(StructSize)0x10001);
    }
    else {
      capnp::_::PointerBuilder::getStructList
                ((ListBuilder *)local_98,(PointerBuilder *)&local_70,(StructSize)0x40003,(word *)0x0
                );
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,(ListBuilder *)local_98,
                 this->childInitializedCount);
      local_48.pointer = (this->sourceInfo)._builder.pointers + 1;
      local_48.segment = (this->sourceInfo)._builder.segment;
      local_48.capTable = (this->sourceInfo)._builder.capTable;
      capnp::_::PointerBuilder::getStructList(&local_70,&local_48,(StructSize)0x10001,(word *)0x0);
    }
    capnp::_::ListBuilder::getStructElement
              (&(__return_storage_ptr__->sourceInfo)._builder,&local_70,this->childInitializedCount)
    ;
    *puVar1 = *puVar1 + 1;
    return __return_storage_ptr__;
  }
  local_98._0_8_ = puVar1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&>
            ((Fault *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x474,FAILED,"childInitializedCount < childCount","_kjCondition,",
             (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_98);
  kj::_::Debug::Fault::fatal((Fault *)&local_70);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }